

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsDiv.c
# Opt level: O2

Vec_Ptr_t * Abc_MfsComputeDivisors(Mfs_Man_t *p,Abc_Obj_t *pNode,int nLevDivMax)

{
  void **ppvVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar5;
  long *plVar6;
  ulong uVar7;
  Mfs_Par_t *pMVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uint local_40;
  
  if (p->vDivs != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vDivs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsDiv.c"
                  ,199,"Vec_Ptr_t *Abc_MfsComputeDivisors(Mfs_Man_t *, Abc_Obj_t *, int)");
  }
  Abc_NtkIncrementTravId(pNode->pNtk);
  pVVar4 = Abc_MfsWinMarkTfi(pNode);
  iVar3 = pVVar4->nSize;
  iVar10 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
    iVar10 = 0;
  }
  for (; iVar3 != iVar10; iVar10 = iVar10 + 1) {
    Vec_PtrEntry(pVVar4,iVar10);
  }
  Abc_NtkIncrementTravId(pNode->pNtk);
  Abc_MfsWinSweepLeafTfo_rec(pNode,nLevDivMax);
  for (lVar12 = 0; lVar12 < (pNode->vFanins).nSize; lVar12 = lVar12 + 1) {
    Abc_NodeSetTravIdCurrent
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar12]]);
  }
  p_00 = Vec_PtrAlloc(p->pPars->nWinMax);
  for (iVar10 = 0; iVar3 != iVar10; iVar10 = iVar10 + 1) {
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pVVar4,iVar10);
    iVar2 = Abc_NodeIsTravIdPrevious(pAVar5);
    if ((iVar2 != 0) && ((int)(*(uint *)&pAVar5->field_0x14 >> 0xc) <= nLevDivMax)) {
      Vec_PtrPush(p_00,pAVar5);
      local_40 = p_00->nSize;
      if (p->pPars->nWinMax <= (int)local_40) goto LAB_003b1ac6;
    }
  }
  local_40 = p_00->nSize;
LAB_003b1ac6:
  free(pVVar4->pArray);
  free(pVVar4);
  iVar3 = p->pPars->nWinMax;
  if ((int)local_40 < iVar3) {
    iVar10 = 0;
    do {
      if ((int)local_40 <= iVar10) break;
      plVar6 = (long *)Vec_PtrEntry(p_00,iVar10);
      for (lVar12 = 0;
          (pMVar8 = p->pPars, lVar12 < *(int *)((long)plVar6 + 0x2c) &&
          ((long)pMVar8->nFanoutsMax == 0 || lVar12 <= pMVar8->nFanoutsMax)); lVar12 = lVar12 + 1) {
        pAVar5 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                  (long)*(int *)(plVar6[6] + lVar12 * 4) * 8);
        iVar3 = Abc_NodeIsTravIdPrevious(pAVar5);
        if ((iVar3 == 0) &&
           ((iVar3 = Abc_NodeIsTravIdCurrent(pAVar5), iVar3 == 0 &&
            ((int)(*(uint *)&pAVar5->field_0x14 >> 0xc) <= nLevDivMax &&
             (*(uint *)&pAVar5->field_0x14 & 0xf) == 7)))) {
          for (lVar11 = 0; iVar3 = (pAVar5->vFanins).nSize, lVar11 < iVar3; lVar11 = lVar11 + 1) {
            iVar3 = Abc_NodeIsTravIdPrevious
                              ((Abc_Obj_t *)
                               pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[lVar11]]);
            if (iVar3 == 0) {
              iVar3 = (pAVar5->vFanins).nSize;
              break;
            }
          }
          if (iVar3 <= (int)lVar11) {
            Vec_PtrPush(p_00,pAVar5);
            pVVar4 = p->vNodes;
            uVar7 = (ulong)(uint)pVVar4->nSize;
            if (pVVar4->nSize < 1) {
              uVar7 = 0;
            }
            uVar9 = 0;
            do {
              if (uVar7 == uVar9) {
                Vec_PtrPush(pVVar4,pAVar5);
                break;
              }
              ppvVar1 = pVVar4->pArray + uVar9;
              uVar9 = uVar9 + 1;
            } while ((Abc_Obj_t *)*ppvVar1 != pAVar5);
            Abc_NodeSetTravId(pAVar5,pAVar5->pNtk->nTravIds + -1);
            local_40 = p_00->nSize;
            pMVar8 = p->pPars;
            if (pMVar8->nWinMax <= (int)local_40) break;
          }
        }
      }
      iVar3 = pMVar8->nWinMax;
      iVar10 = iVar10 + 1;
    } while ((int)local_40 < iVar3);
  }
  p->nMaxDivs = p->nMaxDivs + (uint)(iVar3 <= (int)local_40);
  if (1 < (int)local_40) {
    qsort(p_00->pArray,(ulong)local_40,8,Abc_NodeCompareLevelsIncrease);
  }
  for (lVar12 = 0; lVar12 < (pNode->vFanins).nSize; lVar12 = lVar12 + 1) {
    Vec_PtrPush(p_00,pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar12]]);
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Abc_MfsComputeDivisors( Mfs_Man_t * p, Abc_Obj_t * pNode, int nLevDivMax )
{
    Vec_Ptr_t * vCone, * vDivs;
    Abc_Obj_t * pObj, * pFanout, * pFanin;
    int k, f, m;
    int nDivsPlus = 0, nTrueSupp;
    assert( p->vDivs == NULL );

    // mark the TFI with the current trav ID
    Abc_NtkIncrementTravId( pNode->pNtk );
    vCone = Abc_MfsWinMarkTfi( pNode );

    // count the number of PIs
    nTrueSupp = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, k )
        nTrueSupp += Abc_ObjIsCi(pObj);
//    printf( "%d(%d) ", Vec_PtrSize(p->vSupp), m );

    // mark with the current trav ID those nodes that should not be divisors:
    // (1) the node and its TFO
    // (2) the MFFC of the node
    // (3) the node's fanins (these are treated as a special case)
    Abc_NtkIncrementTravId( pNode->pNtk );
    Abc_MfsWinSweepLeafTfo_rec( pNode, nLevDivMax );
//    Abc_MfsWinVisitMffc( pNode );
    Abc_ObjForEachFanin( pNode, pObj, k )
        Abc_NodeSetTravIdCurrent( pObj );

    // at this point the nodes are marked with two trav IDs:
    // nodes to be collected as divisors are marked with previous trav ID
    // nodes to be avoided as divisors are marked with current trav ID

    // start collecting the divisors
    vDivs = Vec_PtrAlloc( p->pPars->nWinMax );
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, k )
    {
        if ( !Abc_NodeIsTravIdPrevious(pObj) )
            continue;
        if ( (int)pObj->Level > nLevDivMax )
            continue;
        Vec_PtrPush( vDivs, pObj );
        if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
            break;
    }
    Vec_PtrFree( vCone );

    // explore the fanouts of already collected divisors
    if ( Vec_PtrSize(vDivs) < p->pPars->nWinMax )
    Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pObj, k )
    {
        // consider fanouts of this node
        Abc_ObjForEachFanout( pObj, pFanout, f )
        {
            // stop if there are too many fanouts
            if ( p->pPars->nFanoutsMax && f > p->pPars->nFanoutsMax )
                break;
            // skip nodes that are already added
            if ( Abc_NodeIsTravIdPrevious(pFanout) )
                continue;
            // skip nodes in the TFO or in the MFFC of node
            if ( Abc_NodeIsTravIdCurrent(pFanout) )
                continue;
            // skip COs
            if ( !Abc_ObjIsNode(pFanout) ) 
                continue;
            // skip nodes with large level
            if ( (int)pFanout->Level > nLevDivMax )
                continue;
            // skip nodes whose fanins are not divisors  -- here we skip more than we need to skip!!! (revise later)  August 7, 2009
            Abc_ObjForEachFanin( pFanout, pFanin, m )
                if ( !Abc_NodeIsTravIdPrevious(pFanin) )
                    break;
            if ( m < Abc_ObjFaninNum(pFanout) )
                continue;
            // make sure this divisor in not among the nodes
//            Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pFanin, m )
//                assert( pFanout != pFanin );
            // add the node to the divisors
            Vec_PtrPush( vDivs, pFanout );
//            Vec_PtrPush( p->vNodes, pFanout );
            Vec_PtrPushUnique( p->vNodes, pFanout );
            Abc_NodeSetTravIdPrevious( pFanout );
            nDivsPlus++;
            if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
                break;
        }
        if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
            break;
    }
    p->nMaxDivs += (Vec_PtrSize(vDivs) >= p->pPars->nWinMax);

    // sort the divisors by level in the increasing order
    Vec_PtrSort( vDivs, (int (*)(void))Abc_NodeCompareLevelsIncrease );

    // add the fanins of the node
    Abc_ObjForEachFanin( pNode, pFanin, k )
        Vec_PtrPush( vDivs, pFanin );

/*
    printf( "Node level = %d.  ", Abc_ObjLevel(p->pNode) );
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vDivs, pObj, k, Vec_PtrSize(vDivs)-p->nDivsPlus )
        printf( "%d ", Abc_ObjLevel(pObj) );
    printf( "\n" );
*/
//printf( "%d ", p->nDivsPlus );
//    printf( "(%d+%d)(%d+%d+%d) ", Vec_PtrSize(p->vSupp), Vec_PtrSize(p->vNodes), 
//        nTrueSupp, Vec_PtrSize(vDivs)-nTrueSupp-nDivsPlus, nDivsPlus );
    return vDivs;
}